

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathCompiledEvalInternal
              (xmlXPathCompExprPtr comp,xmlXPathContextPtr ctxt,xmlXPathObjectPtr *resObjPtr,
              int toBool)

{
  int iVar1;
  uint uVar2;
  xmlXPathParserContextPtr ctxt_00;
  xmlXPathObjectPtr *ppxVar3;
  xmlXPathObjectPtr obj;
  
  if (comp == (xmlXPathCompExprPtr)0x0) {
    return -1;
  }
  xmlInitParser();
  xmlResetError(&ctxt->lastError);
  ctxt_00 = (xmlXPathParserContextPtr)(*xmlMalloc)(0x58);
  if (ctxt_00 == (xmlXPathParserContextPtr)0x0) {
LAB_001c14af:
    if (ctxt != (xmlXPathContextPtr)0x0) {
      xmlRaiseMemoryError(ctxt->error,(xmlGenericErrorFunc)0x0,ctxt->userData,0xc,&ctxt->lastError);
    }
    return -1;
  }
  ctxt_00->value = (xmlXPathObjectPtr)0x0;
  ctxt_00->valueNr = 0;
  ctxt_00->valueMax = 0;
  *(undefined8 *)&ctxt_00->xptr = 0;
  ctxt_00->ancestor = (xmlNodePtr)0x0;
  ctxt_00->valueTab = (xmlXPathObjectPtr *)0x0;
  ctxt_00->comp = (xmlXPathCompExprPtr)0x0;
  *(undefined8 *)&ctxt_00->error = 0;
  ctxt_00->context = (xmlXPathContextPtr)0x0;
  ctxt_00->cur = (xmlChar *)0x0;
  ctxt_00->base = (xmlChar *)0x0;
  *(undefined8 *)&ctxt_00->valueFrame = 0;
  ctxt_00->valueMax = 10;
  ppxVar3 = (xmlXPathObjectPtr *)(*xmlMalloc)(0x50);
  ctxt_00->valueTab = ppxVar3;
  if (ppxVar3 == (xmlXPathObjectPtr *)0x0) {
    (*xmlFree)(ctxt_00);
    goto LAB_001c14af;
  }
  ctxt_00->valueNr = 0;
  ctxt_00->value = (xmlXPathObjectPtr)0x0;
  ctxt_00->context = ctxt;
  ctxt_00->comp = comp;
  iVar1 = xmlXPathRunEval(ctxt_00,toBool);
  if (ctxt_00->error == 0) {
    uVar2 = ctxt_00->valueNr;
    if (uVar2 == (toBool == 0)) {
      if (uVar2 != 0 && toBool == 0) {
        uVar2 = uVar2 - 1;
        ctxt_00->valueNr = uVar2;
        ctxt_00->value = (xmlXPathObjectPtr)0x0;
        obj = ctxt_00->valueTab[uVar2];
        ctxt_00->valueTab[uVar2] = (xmlXPathObjectPtr)0x0;
        goto LAB_001c14e7;
      }
    }
    else {
      xmlXPathErr(ctxt_00,0x17);
    }
  }
  obj = (xmlXPathObjectPtr)0x0;
LAB_001c14e7:
  if (resObjPtr == (xmlXPathObjectPtr *)0x0) {
    xmlXPathReleaseObject(ctxt,obj);
  }
  else {
    *resObjPtr = obj;
  }
  ctxt_00->comp = (xmlXPathCompExprPtr)0x0;
  xmlXPathFreeParserContext(ctxt_00);
  return iVar1;
}

Assistant:

static int
xmlXPathCompiledEvalInternal(xmlXPathCompExprPtr comp,
			     xmlXPathContextPtr ctxt,
			     xmlXPathObjectPtr *resObjPtr,
			     int toBool)
{
    xmlXPathParserContextPtr pctxt;
    xmlXPathObjectPtr resObj = NULL;
    int res;

    if (comp == NULL)
	return(-1);
    xmlInitParser();

    xmlResetError(&ctxt->lastError);

    pctxt = xmlXPathCompParserContext(comp, ctxt);
    if (pctxt == NULL)
        return(-1);
    res = xmlXPathRunEval(pctxt, toBool);

    if (pctxt->error == XPATH_EXPRESSION_OK) {
        if (pctxt->valueNr != ((toBool) ? 0 : 1))
            xmlXPathErr(pctxt, XPATH_STACK_ERROR);
        else if (!toBool)
            resObj = xmlXPathValuePop(pctxt);
    }

    if (resObjPtr)
        *resObjPtr = resObj;
    else
        xmlXPathReleaseObject(ctxt, resObj);

    pctxt->comp = NULL;
    xmlXPathFreeParserContext(pctxt);

    return(res);
}